

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O0

void end_element_handler(void *data,char *el)

{
  coda_type_special *definition_00;
  coda_mem_array *type_00;
  long lVar1;
  int iVar2;
  coda_mem_data *base_type_00;
  coda_dynamic_type *field_type;
  int i;
  coda_dynamic_type *base_type;
  coda_type *definition;
  coda_mem_data *pcStack_30;
  int index;
  coda_mem_type *type;
  coda_mem_record *parent;
  parser_info_conflict *info;
  char *el_local;
  void *data_local;
  
  if (*(int *)((long)data + 8) != 0) {
    return;
  }
  if (((*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) != 0) &&
      (0 < *(long *)((long)data + 0x430))) &&
     (iVar2 = is_whitespace(*(char **)((long)data + 0x440),(int)*(undefined8 *)((long)data + 0x430))
     , iVar2 == 0)) {
    if (*(int *)((long)data + 0x428) == 0) {
      __assert_fail("info->update_definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x250,"void end_element_handler(void *, const char *)");
    }
    if (0 < *(long *)(*(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120
                                         ) + 8) + 0x48)) {
      coda_set_error(-300,"mixed content for element \'%s\' is not supported",
                     *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 800));
      abort_parser((parser_info_conflict *)data);
      return;
    }
    *(undefined8 *)((long)data + 0x420) =
         *(undefined8 *)
          (*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 0x18);
    *(undefined8 *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 0x18) =
         0;
    iVar2 = convert_to_text(*(coda_type ***)
                             ((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20));
    if (iVar2 != 0) {
      abort_parser((parser_info_conflict *)data);
      return;
    }
    coda_dynamic_type_delete
              (*(coda_dynamic_type **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120));
    *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) = 0;
  }
  if (*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) == 0) {
    definition_00 =
         (coda_type_special *)
         **(undefined8 **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20);
    if (definition_00->type_class == coda_special_class) {
      if (*(int *)((long)data + 0x428) != 0) {
        __assert_fail("!info->update_definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x26d,"void end_element_handler(void *, const char *)");
      }
      base_type_00 = coda_mem_data_new(definition_00->base_type,(coda_dynamic_type *)0x0,
                                       *(coda_product **)((long)data + 0x10),
                                       *(long *)((long)data + 0x430),
                                       *(uint8_t **)((long)data + 0x440));
      if (base_type_00 == (coda_mem_data *)0x0) {
        abort_parser((parser_info_conflict *)data);
        return;
      }
      pcStack_30 = (coda_mem_data *)
                   coda_mem_time_new(definition_00,*(coda_dynamic_type **)((long)data + 0x420),
                                     (coda_dynamic_type *)base_type_00);
      if (pcStack_30 == (coda_mem_data *)0x0) {
        coda_dynamic_type_delete((coda_dynamic_type *)base_type_00);
        abort_parser((parser_info_conflict *)data);
        return;
      }
    }
    else {
      pcStack_30 = coda_mem_data_new((coda_type *)definition_00,
                                     *(coda_dynamic_type **)((long)data + 0x420),
                                     *(coda_product **)((long)data + 0x10),
                                     *(long *)((long)data + 0x430),*(uint8_t **)((long)data + 0x440)
                                    );
      if (pcStack_30 == (coda_mem_data *)0x0) {
        abort_parser((parser_info_conflict *)data);
        return;
      }
    }
    *(undefined8 *)((long)data + 0x420) = 0;
  }
  else {
    if (*(int *)((long)data + 0x428) == 0) {
      iVar2 = coda_mem_record_validate
                        (*(coda_mem_record **)
                          ((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120));
      if (iVar2 != 0) {
        abort_parser((parser_info_conflict *)data);
        return;
      }
      for (field_type._4_4_ = 0;
          (long)field_type._4_4_ <
          *(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 0x20);
          field_type._4_4_ = field_type._4_4_ + 1) {
        type_00 = *(coda_mem_array **)
                   (*(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120)
                             + 0x28) + (long)field_type._4_4_ * 8);
        if (((type_00 != (coda_mem_array *)0x0) &&
            (type_00->definition->type_class == coda_array_class)) &&
           (type_00->definition->format == coda_format_xml)) {
          iVar2 = coda_mem_array_validate(type_00);
          if (iVar2 != 0) {
            abort_parser((parser_info_conflict *)data);
            return;
          }
          if ((type_00->num_elements == 0) &&
             (*(char *)(*(long *)(*(long *)(*(long *)(*(long *)((long)data +
                                                               (long)*(int *)((long)data + 0x18) * 8
                                                               + 0x120) + 8) + 0x50) +
                                 (long)field_type._4_4_ * 8) + 0x1c) != '\0')) {
            coda_mem_type_delete((coda_dynamic_type *)type_00);
            *(undefined8 *)
             (*(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 0x28
                       ) + (long)field_type._4_4_ * 8) = 0;
          }
        }
      }
    }
    pcStack_30 = *(coda_mem_data **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120);
    *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) = 0;
  }
  if (*(long *)((long)data + 0x420) != 0) {
    __assert_fail("info->attributes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x2b6,"void end_element_handler(void *, const char *)");
  }
  lVar1 = *(long *)((long)data + (long)(*(int *)((long)data + 0x18) + -1) * 8 + 0x120);
  iVar2 = (int)*(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x220);
  if (*(long *)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 8) == 0) {
    *(coda_mem_data **)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 8) = pcStack_30;
  }
  else {
    if ((*(int *)(*(long *)(*(long *)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 8) + 8) + 8) != 1) ||
       (**(int **)(*(long *)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 8) + 8) != 2)) {
      __assert_fail("parent->field_type[index]->definition->type_class == coda_array_class && parent->field_type[index]->definition->format == coda_format_xml"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x2be,"void end_element_handler(void *, const char *)");
    }
    iVar2 = coda_mem_array_add_element
                      (*(coda_mem_array **)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 8),
                       (coda_dynamic_type *)pcStack_30);
    if (iVar2 != 0) {
      coda_dynamic_type_delete((coda_dynamic_type *)pcStack_30);
      abort_parser((parser_info_conflict *)data);
      return;
    }
  }
  *(int *)((long)data + 0x18) = *(int *)((long)data + 0x18) + -1;
  *(undefined8 *)((long)data + 0x430) = 0;
  return;
}

Assistant:

static void XMLCALL end_element_handler(void *data, const char *el)
{
    parser_info *info = (parser_info *)data;
    coda_mem_record *parent;
    coda_mem_type *type;
    int index;

    (void)el;

    if (info->abort_parser)
    {
        return;
    }

    /* we are dealing with a record if info->record[info->depth] != NULL */
    if (info->record[info->depth] != NULL && info->value_length > 0 && !is_whitespace(info->value, info->value_length))
    {
        assert(info->update_definition);        /* other case is already handled in character_data_handler() */
        if (((coda_type_record *)info->record[info->depth]->definition)->num_fields > 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "mixed content for element '%s' is not supported",
                           info->xml_name[info->depth]);
            abort_parser(info);
            return;
        }
        /* convert definition from record to text */
        info->attributes = info->record[info->depth]->attributes;
        info->record[info->depth]->attributes = NULL;
        if (convert_to_text(info->definition[info->depth]) != 0)
        {
            abort_parser(info);
            return;
        }
        /* delete the record we created in start_element_handler() */
        coda_dynamic_type_delete((coda_dynamic_type *)info->record[info->depth]);
        info->record[info->depth] = NULL;
    }

    if (info->record[info->depth] == NULL)
    {
        coda_type *definition = *info->definition[info->depth];

        if (definition->type_class == coda_special_class)
        {
            coda_dynamic_type *base_type;

            assert(!info->update_definition);

            base_type = (coda_dynamic_type *)coda_mem_data_new(((coda_type_special *)definition)->base_type, NULL,
                                                               (coda_product *)info->product, info->value_length,
                                                               (uint8_t *)info->value);
            if (base_type == NULL)
            {
                abort_parser(info);
                return;
            }

            type = (coda_mem_type *)coda_mem_time_new((coda_type_special *)definition, info->attributes, base_type);
            if (type == NULL)
            {
                coda_dynamic_type_delete(base_type);
                abort_parser(info);
                return;
            }
        }
        else
        {
            type = (coda_mem_type *)coda_mem_data_new(definition, info->attributes, (coda_product *)info->product,
                                                      info->value_length, (uint8_t *)info->value);
            if (type == NULL)
            {
                abort_parser(info);
                return;
            }
        }
        info->attributes = NULL;
    }
    else
    {
        if (!info->update_definition)
        {
            int i;

            if (coda_mem_record_validate(info->record[info->depth]) != 0)
            {
                abort_parser(info);
                return;
            }

            /* also validate all fields that are arrays of xml elements */
            for (i = 0; i < info->record[info->depth]->num_fields; i++)
            {
                coda_dynamic_type *field_type = info->record[info->depth]->field_type[i];

                if (field_type != NULL)
                {
                    if (field_type->definition->type_class == coda_array_class &&
                        field_type->definition->format == coda_format_xml)
                    {
                        if (coda_mem_array_validate((coda_mem_array *)field_type) != 0)
                        {
                            abort_parser(info);
                            return;
                        }
                        /* if the array is empty and the field is optional then remove the array */
                        if (((coda_mem_array *)field_type)->num_elements == 0 &&
                            info->record[info->depth]->definition->field[i]->optional)
                        {
                            coda_mem_type_delete(field_type);
                            info->record[info->depth]->field_type[i] = NULL;
                        }
                    }
                }
            }
        }
        type = (coda_mem_type *)info->record[info->depth];
        info->record[info->depth] = NULL;
    }

    assert(info->attributes == NULL);

    parent = info->record[info->depth - 1];
    index = info->index[info->depth];
    if (parent->field_type[index] != NULL)
    {
        /* add the child element to the array */
        assert(parent->field_type[index]->definition->type_class == coda_array_class &&
               parent->field_type[index]->definition->format == coda_format_xml);
        if (coda_mem_array_add_element((coda_mem_array *)parent->field_type[index], (coda_dynamic_type *)type) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)type);
            abort_parser(info);
            return;
        }
    }
    else
    {
        parent->field_type[index] = (coda_dynamic_type *)type;
    }

    info->depth--;
    info->value_length = 0;
}